

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_remove_window(nk_context *ctx,nk_window *win)

{
  byte *pbVar1;
  nk_window *pnVar2;
  nk_window *pnVar3;
  nk_window *pnVar4;
  nk_window *pnVar5;
  
  if (ctx->begin == win) {
    pnVar3 = win->next;
    ctx->begin = pnVar3;
    if (pnVar3 != (nk_window *)0x0) {
      pnVar3->prev = (nk_window *)0x0;
    }
LAB_0012864d:
    pnVar5 = ctx->end;
    if (pnVar5 != win) goto LAB_00128681;
    pnVar2 = win->prev;
    ctx->end = pnVar2;
    pnVar4 = (nk_window *)0x0;
    pnVar3 = pnVar2;
    pnVar5 = (nk_window *)0x0;
  }
  else {
    pnVar3 = ctx->end;
    if (pnVar3 == win) goto LAB_0012864d;
    pnVar4 = win->next;
    pnVar2 = win->prev;
    pnVar5 = pnVar3;
    if (pnVar4 != (nk_window *)0x0) {
      pnVar4->prev = pnVar2;
    }
  }
  if (pnVar2 != (nk_window *)0x0) {
    pnVar2->next = pnVar4;
    pnVar5 = pnVar3;
  }
LAB_00128681:
  if ((ctx->active == win || ctx->active == (nk_window *)0x0) &&
     (ctx->active = pnVar5, pnVar5 != (nk_window *)0x0)) {
    pbVar1 = (byte *)((long)&pnVar5->flags + 1);
    *pbVar1 = *pbVar1 & 0xef;
  }
  win->next = (nk_window *)0x0;
  win->prev = (nk_window *)0x0;
  ctx->count = ctx->count - 1;
  return;
}

Assistant:

NK_LIB void
nk_remove_window(struct nk_context *ctx, struct nk_window *win)
{
    if (win == ctx->begin || win == ctx->end) {
        if (win == ctx->begin) {
            ctx->begin = win->next;
            if (win->next)
                win->next->prev = 0;
        }
        if (win == ctx->end) {
            ctx->end = win->prev;
            if (win->prev)
                win->prev->next = 0;
        }
    } else {
        if (win->next)
            win->next->prev = win->prev;
        if (win->prev)
            win->prev->next = win->next;
    }
    if (win == ctx->active || !ctx->active) {
        ctx->active = ctx->end;
        if (ctx->end)
            ctx->end->flags &= ~(nk_flags)NK_WINDOW_ROM;
    }
    win->next = 0;
    win->prev = 0;
    ctx->count--;
}